

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,string_view undefined_symbol)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  ErrorLocation EVar1;
  Message *pMVar2;
  ulong uVar3;
  anon_class_16_2_b89d2f30 local_b0;
  VoidPtr local_a0;
  Invoker<std::__cxx11::basic_string<char>_> local_98;
  DescriptorBuilder *local_90;
  char *local_88;
  anon_class_8_1_8991fb9c local_80;
  VoidPtr local_78;
  Invoker<std::__cxx11::basic_string<char>_> local_70;
  DescriptorBuilder *local_68;
  char *local_60;
  anon_class_8_1_c7454de5 local_58;
  VoidPtr local_50;
  Invoker<std::__cxx11::basic_string<char>_> local_48;
  DescriptorBuilder *local_40;
  char *local_38;
  ErrorLocation local_2c;
  Message *pMStack_28;
  ErrorLocation location_local;
  Message *descriptor_local;
  DescriptorBuilder *this_local;
  string_view element_name_local;
  
  element_name_local._M_len = (size_t)element_name._M_str;
  this_local = (DescriptorBuilder *)element_name._M_len;
  local_2c = location;
  pMStack_28 = descriptor;
  descriptor_local = (Message *)this;
  if ((this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) &&
     (uVar3 = std::__cxx11::string::empty(), pMVar2 = pMStack_28, EVar1 = local_2c, (uVar3 & 1) != 0
     )) {
    local_40 = this_local;
    local_38 = (char *)element_name_local._M_len;
    local_58.undefined_symbol = &undefined_symbol;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_50,&local_58);
    element_name_02._M_str = local_38;
    element_name_02._M_len = (size_t)local_40;
    make_error.invoker_ = local_48;
    make_error.ptr_.obj = local_50.obj;
    AddError(this,element_name_02,pMVar2,EVar1,make_error);
  }
  else {
    pMVar2 = pMStack_28;
    EVar1 = local_2c;
    if (this->possible_undeclared_dependency_ != (FileDescriptor *)0x0) {
      local_68 = this_local;
      local_60 = (char *)element_name_local._M_len;
      local_80.this = this;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_78,&local_80);
      element_name_01._M_str = local_60;
      element_name_01._M_len = (size_t)local_68;
      make_error_00.invoker_ = local_70;
      make_error_00.ptr_.obj = local_78.obj;
      AddError(this,element_name_01,pMVar2,EVar1,make_error_00);
    }
    uVar3 = std::__cxx11::string::empty();
    pMVar2 = pMStack_28;
    EVar1 = local_2c;
    if ((uVar3 & 1) == 0) {
      local_90 = this_local;
      local_88 = (char *)element_name_local._M_len;
      local_b0.undefined_symbol = &undefined_symbol;
      local_b0.this = this;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__2,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_a0,&local_b0);
      element_name_00._M_str = local_88;
      element_name_00._M_len = (size_t)local_90;
      make_error_01.invoker_ = local_98;
      make_error_01.ptr_.obj = local_a0.obj;
      AddError(this,element_name_00,pMVar2,EVar1,make_error_01);
    }
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddNotDefinedError(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const absl::string_view undefined_symbol) {
  if (possible_undeclared_dependency_ == nullptr &&
      undefine_resolved_name_.empty()) {
    AddError(element_name, descriptor, location, [&] {
      return absl::StrCat("\"", undefined_symbol, "\" is not defined.");
    });
  } else {
    if (possible_undeclared_dependency_ != nullptr) {
      AddError(element_name, descriptor, location, [&] {
        return absl::StrCat("\"", possible_undeclared_dependency_name_,
                            "\" seems to be defined in \"",
                            possible_undeclared_dependency_->name(),
                            "\", which is not "
                            "imported by \"",
                            filename_,
                            "\".  To use it here, please "
                            "add the necessary import.");
      });
    }
    if (!undefine_resolved_name_.empty()) {
      AddError(element_name, descriptor, location, [&] {
        return absl::StrCat(
            "\"", undefined_symbol, "\" is resolved to \"",
            undefine_resolved_name_,
            "\", which is not defined. "
            "The innermost scope is searched first in name resolution. "
            "Consider using a leading '.'(i.e., \".",
            undefined_symbol, "\") to start from the outermost scope.");
      });
    }
  }
}